

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-split.cpp
# Opt level: O2

void __thiscall
split_strategy::split_strategy
          (split_strategy *this,split_params *params,ifstream *f_input,gguf_context *ctx_gguf,
          ggml_context *ctx_meta)

{
  pointer ppgVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  int i;
  long lVar7;
  vector<gguf_context_*,_std::allocator<gguf_context_*>_> *__range1;
  size_t next_size;
  gguf_context **ctx;
  pointer ppgVar8;
  gguf_context *ctx_out;
  gguf_context *ctx_gguf_local;
  int i_split;
  anon_class_32_4_220f47be new_ctx_out;
  
  ctx_gguf_local = ctx_gguf;
  split_params::split_params(&this->params,params);
  this->f_input = f_input;
  this->ctx_gguf = ctx_gguf;
  this->ctx_meta = ctx_meta;
  iVar3 = gguf_get_n_tensors(ctx_gguf);
  this->n_tensors = iVar3;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_ctx_out.i_split = &i_split;
  i_split = -1;
  new_ctx_out.ctx_out = &ctx_out;
  ctx_out = (gguf_context *)0x0;
  new_ctx_out.ctx_gguf = &ctx_gguf_local;
  new_ctx_out.this = this;
  split_strategy::anon_class_32_4_220f47be::operator()(&new_ctx_out,false);
  if (params->no_tensor_first_split != false) {
    split_strategy::anon_class_32_4_220f47be::operator()(&new_ctx_out,true);
  }
  next_size = 0;
  for (lVar7 = 0; lVar7 < this->n_tensors; lVar7 = lVar7 + 1) {
    uVar4 = gguf_get_tensor_name(ctx_gguf_local,lVar7);
    uVar4 = ggml_get_tensor(ctx_meta,uVar4);
    lVar5 = ggml_nbytes(uVar4);
    uVar6 = lVar5 + 0x1fU & 0xffffffffffffffe0;
    next_size = next_size + uVar6;
    bVar2 = should_split(this,(int)lVar7,next_size);
    if (bVar2) {
      split_strategy::anon_class_32_4_220f47be::operator()(&new_ctx_out,false);
      next_size = uVar6;
    }
    gguf_add_tensor(ctx_out,uVar4);
  }
  std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::push_back(&this->ctx_outs,&ctx_out);
  ppgVar1 = (this->ctx_outs).super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppgVar8 = (this->ctx_outs).
                 super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppgVar8 != ppgVar1; ppgVar8 = ppgVar8 + 1) {
    gguf_set_val_u16(*ppgVar8,"split.count",
                     (uint)(*(int *)&(this->ctx_outs).
                                     super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->ctx_outs).
                                    super__Vector_base<gguf_context_*,_std::allocator<gguf_context_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff);
  }
  return;
}

Assistant:

split_strategy(const split_params & params,
            std::ifstream & f_input,
            struct gguf_context * ctx_gguf,
            struct ggml_context * ctx_meta) :
        params(params),
        f_input(f_input),
        ctx_gguf(ctx_gguf),
        ctx_meta(ctx_meta),
        n_tensors(gguf_get_n_tensors(ctx_gguf)) {

        // because we need to know list of tensors for each file in advance, we will build all the ctx_out for all output splits
        int i_split = -1;
        struct gguf_context * ctx_out = NULL;
        auto new_ctx_out = [&](bool allow_no_tensors) {
            i_split++;
            if (ctx_out != NULL) {
                if (gguf_get_n_tensors(ctx_out) == 0 && !allow_no_tensors) {
                    fprintf(stderr, "error: one of splits have 0 tensors. Maybe size or tensors limit is too small\n");
                    exit(EXIT_FAILURE);
                }
                ctx_outs.push_back(ctx_out);
            }
            ctx_out = gguf_init_empty();
            // Save all metadata in first split only
            if (i_split == 0) {
                gguf_set_kv(ctx_out, ctx_gguf);
            }
            gguf_set_val_u16(ctx_out, LLM_KV_SPLIT_NO, i_split);
            gguf_set_val_u16(ctx_out, LLM_KV_SPLIT_COUNT, 0); // placeholder
            gguf_set_val_i32(ctx_out, LLM_KV_SPLIT_TENSORS_COUNT, n_tensors);
        };

        // initialize ctx_out for the first split
        new_ctx_out(false);

        // skip first split if no_tensor_first_split is set
        if (params.no_tensor_first_split) {
            new_ctx_out(true);
        }

        // process tensors one by one
        size_t curr_tensors_size = 0; // current size by counting only tensors size (without metadata)
        for (int i = 0; i < n_tensors; ++i) {
            struct ggml_tensor * t = ggml_get_tensor(ctx_meta, gguf_get_tensor_name(ctx_gguf, i));
            // calculate the "imaginary" size = the current size + next tensor size
            size_t n_bytes = GGML_PAD(ggml_nbytes(t), GGUF_DEFAULT_ALIGNMENT);
            size_t next_tensors_size = curr_tensors_size + n_bytes;
            if (should_split(i, next_tensors_size)) {
                new_ctx_out(false);
                curr_tensors_size = n_bytes;
            } else {
                curr_tensors_size = next_tensors_size;
            }
            gguf_add_tensor(ctx_out, t);
        }

        // push the last ctx_out
        ctx_outs.push_back(ctx_out);

        // set the correct n_split for all ctx_out
        for (auto & ctx : ctx_outs) {
            gguf_set_val_u16(ctx, LLM_KV_SPLIT_COUNT, ctx_outs.size());
        }
    }